

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleserver.hpp
# Opt level: O0

StateStatus __thiscall SimpleServer::HttpParser::parsePath(HttpParser *this)

{
  bool bVar1;
  size_t sVar2;
  pointer ppVar3;
  ulong uVar4;
  reference pbVar5;
  mapped_type *this_00;
  bool local_1c1;
  string local_1a0 [39];
  allocator<char> local_179;
  string local_178 [8];
  string value;
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param;
  iterator __end3;
  iterator __begin3;
  string local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  _Self local_b8;
  allocator<char> local_a9;
  key_type local_a8;
  _Self local_88;
  iterator it;
  string local_70 [32];
  undefined1 local_50 [8];
  string params;
  HttpParser *this_local;
  
  sVar2 = std::__cxx11::string::find((char *)&(this->httpRequest).uri,0x110803);
  this->pos = sVar2;
  std::__cxx11::string::substr((ulong)((long)&params.field_2 + 8),(ulong)&(this->httpRequest).uri);
  std::__cxx11::string::operator=
            ((string *)&(this->httpRequest).path,(string *)(params.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(params.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_50);
  if (this->pos != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)local_70,(ulong)&(this->httpRequest).uri);
    std::__cxx11::string::operator=((string *)local_50,local_70);
    std::__cxx11::string::~string(local_70);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"content-type",&local_a9);
  local_88._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&(this->httpRequest).headers,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  local_b8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&(this->httpRequest).headers);
  bVar1 = std::operator!=(&local_88,&local_b8);
  local_1c1 = false;
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_88);
    local_1c1 = std::operator==(&ppVar3->second,"application/x-www-form-urlencoded");
  }
  if (local_1c1 != false) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3,
                   "&",&(this->httpRequest).body);
    std::__cxx11::string::operator+=((string *)local_50,(string *)&__range3);
    std::__cxx11::string::~string((string *)&__range3);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"&",(allocator<char> *)((long)&__begin3._M_current + 7));
    split(&local_f8,(string *)local_50,&local_118,true);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__begin3._M_current + 7));
    local_e0 = &local_f8;
    __end3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(local_e0);
    param = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(local_e0);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&param), bVar1) {
      pbVar5 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end3);
      sVar2 = std::__cxx11::string::find((char *)pbVar5,0x110829);
      this->pos = sVar2;
      if ((this->pos != 0) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
        std::__cxx11::string::substr((ulong)((long)&value.field_2 + 8),(ulong)pbVar5);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_178,"",&local_179);
        std::allocator<char>::~allocator(&local_179);
        if (this->pos != 0xffffffffffffffff) {
          std::__cxx11::string::substr((ulong)local_1a0,(ulong)pbVar5);
          std::__cxx11::string::operator=(local_178,local_1a0);
          std::__cxx11::string::~string(local_1a0);
        }
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&(this->httpRequest).params,(key_type *)((long)&value.field_2 + 8));
        std::__cxx11::string::operator=((string *)this_00,local_178);
        std::__cxx11::string::~string(local_178);
        std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f8);
  }
  std::__cxx11::string::~string((string *)local_50);
  return OK;
}

Assistant:

StateStatus parsePath()
		{
			pos = httpRequest.uri.find("?");
			httpRequest.path = httpRequest.uri.substr(0, pos);

			std::string params;
			if (pos != std::string::npos)
				params = httpRequest.uri.substr(pos + 1);

			auto it = httpRequest.headers.find("content-type");
			if (it != httpRequest.headers.end() && it->second == "application/x-www-form-urlencoded")
				params += "&" + httpRequest.body;

			if (!params.empty())
			{
				for (const auto& param : split(params, "&", true))
				{
					pos = param.find("=");

					if (pos == 0 || param.empty())
						continue;

					std::string key = param.substr(0, pos);
					std::string value = "";
					if (pos != std::string::npos)
						value = param.substr(pos + 1);

					httpRequest.params[key] = value;
				}
			}

			return OK;
		}